

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Covariance4D.hpp
# Opt level: O1

void __thiscall
Covariance::Covariance4D<Vector,_double>::Projection(Covariance4D<Vector,_double> *this,Vector *n)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  
  dVar1 = (this->x).z * n->z + (this->x).x * n->x + (this->x).y * n->y;
  dVar11 = 0.0;
  if ((dVar1 != 0.0) || (NAN(dVar1))) {
    dVar11 = atan2(dVar1,n->z * (this->y).z + n->x * (this->y).x + n->y * (this->y).y);
  }
  dVar2 = cos(dVar11);
  dVar3 = sin(dVar11);
  dVar10 = -dVar3 * dVar2;
  dVar12 = dVar2 * dVar2;
  dVar13 = dVar3 * dVar3;
  dVar1 = (this->matrix)._M_elems[2];
  dVar11 = (this->matrix)._M_elems[5];
  dVar5 = (this->matrix)._M_elems[8];
  dVar7 = (this->matrix)._M_elems[9];
  dVar15 = (dVar10 + dVar10) * dVar5;
  (this->matrix)._M_elems[9] = dVar11 * dVar13 + (dVar12 * dVar7 - dVar15);
  dVar14 = (this->matrix)._M_elems[3];
  dVar9 = (this->matrix)._M_elems[4];
  dVar4 = (this->matrix)._M_elems[6];
  dVar6 = (this->matrix)._M_elems[7];
  dVar16 = dVar10 * (dVar4 + dVar9);
  dVar17 = dVar10 * (dVar6 - dVar14);
  dVar8 = dVar4 * -dVar13 + dVar12 * dVar9 + dVar17;
  (this->matrix)._M_elems[3] = dVar6 * dVar13 + dVar12 * dVar14 + dVar16;
  (this->matrix)._M_elems[4] = dVar8;
  dVar4 = (this->matrix)._M_elems[6];
  (this->matrix)._M_elems[5] = dVar7 * dVar13 + (this->matrix)._M_elems[5] * dVar12 + dVar15;
  (this->matrix)._M_elems[6] = dVar9 * -dVar13 + dVar4 * dVar12 + dVar17;
  dVar6 = dVar14 * dVar13 + (dVar6 * dVar12 - dVar16);
  (this->matrix)._M_elems[7] = dVar6;
  (this->matrix)._M_elems[8] = dVar5 * (dVar12 - dVar13) + (dVar7 - dVar11) * dVar10;
  dVar11 = (this->z).x;
  dVar14 = (this->matrix)._M_elems[0];
  dVar9 = (this->matrix)._M_elems[1];
  dVar4 = dVar9 * (dVar10 + dVar10);
  dVar5 = (this->z).y;
  dVar7 = (this->z).z;
  (this->matrix)._M_elems[0] = dVar13 * dVar1 + dVar12 * dVar14 + dVar4;
  dVar15 = dVar13 * dVar14 + (dVar12 * dVar1 - dVar4);
  dVar14 = (dVar12 - dVar13) * dVar9 + (dVar1 - dVar14) * dVar10;
  (this->matrix)._M_elems[1] = dVar14;
  (this->matrix)._M_elems[2] = dVar15;
  dVar4 = dVar7 * n->z + dVar11 * n->x + dVar5 * n->y;
  dVar1 = ABS(dVar4);
  (this->matrix)._M_elems[1] = dVar1 * dVar14;
  (this->matrix)._M_elems[2] = dVar4 * dVar4 * dVar15;
  (this->matrix)._M_elems[4] = dVar8 * dVar1;
  (this->matrix)._M_elems[7] = dVar1 * dVar6;
  dVar7 = (this->x).x * dVar2 - (this->y).x * dVar3;
  (this->x).x = dVar7;
  dVar14 = (this->x).y * dVar2 - dVar3 * (this->y).y;
  dVar9 = (this->x).z * dVar2 - dVar3 * (this->y).z;
  (this->x).y = dVar14;
  (this->x).z = dVar9;
  dVar1 = n->x;
  dVar11 = n->y;
  dVar5 = n->z;
  (this->z).x = dVar1;
  (this->z).y = dVar11;
  (this->z).z = dVar5;
  if (0.0 <= dVar4) {
    dVar4 = dVar9 * dVar11 - dVar5 * dVar14;
    dVar5 = dVar7 * dVar5 - dVar1 * dVar9;
    dVar1 = dVar1 * dVar14 - dVar7 * dVar11;
  }
  else {
    dVar4 = dVar5 * dVar14 - dVar9 * dVar11;
    dVar5 = dVar1 * dVar9 - dVar7 * dVar5;
    dVar1 = dVar7 * dVar11 - dVar1 * dVar14;
  }
  (this->y).x = dVar4;
  (this->y).y = dVar5;
  (this->y).z = dVar1;
  return;
}

Assistant:

inline void Projection(const Vector& n) {

         const auto cx = Vector::Dot(x, n);
         const auto cy = Vector::Dot(y, n);

         // Rotate the Frame to be aligned with plane.
         const Float alpha = (cx != 0.0) ? atan2(cx, cy) : 0.0;
         const Float c = cos(alpha), s = -sin(alpha);
         Rotate(c, s);

         // Scale the componnent that project by the cosine of the ray direction
         // and the normal.
         const Float cosine = Vector::Dot(z, n);
         ScaleY(std::abs(cosine));

         // Update direction vectors.
         x = c*x + s*y;
         z = (cosine < 0.0f) ? -n : n;
         y = (cosine < 0.0f) ?  Vector::Cross(x, z) : Vector::Cross(z, x);
      }